

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O1

uint lodepng::convertRGBModel
               (uchar *out,uchar *in,uint w,uint h,LodePNGState *state_out,LodePNGState *state_in,
               uint rendering_intent)

{
  uint uVar1;
  uint uVar2;
  float *out_00;
  ulong uVar3;
  LodePNGInfo *info;
  LodePNGInfo *info_00;
  float whitepoint [3];
  float local_3c [3];
  
  info = &state_in->info_png;
  if (state_in == (LodePNGState *)0x0) {
    info = (LodePNGInfo *)0x0;
  }
  info_00 = &state_out->info_png;
  if (state_out == (LodePNGState *)0x0) {
    info_00 = (LodePNGInfo *)0x0;
  }
  uVar1 = isSRGB(info);
  uVar2 = isSRGB(info_00);
  if ((uVar1 == uVar2) && (info->iccp_defined == info_00->iccp_defined)) {
    if (info->iccp_defined == 0) {
      if ((info->srgb_defined == info_00->srgb_defined) &&
         ((info->srgb_defined != 0 ||
          (((info->gama_defined == info_00->gama_defined &&
            (((info->gama_defined == 0 || (info->gama_gamma == info_00->gama_gamma)) &&
             (info->chrm_defined == info_00->chrm_defined)))) &&
           ((info->chrm_defined == 0 ||
            (((((info->chrm_white_x == info_00->chrm_white_x &&
                (info->chrm_white_y == info_00->chrm_white_y)) &&
               ((info->chrm_red_x == info_00->chrm_red_x &&
                ((info->chrm_red_y == info_00->chrm_red_y &&
                 (info->chrm_green_x == info_00->chrm_green_x)))))) &&
              (info->chrm_green_y == info_00->chrm_green_y)) &&
             ((info->chrm_blue_x == info_00->chrm_blue_x &&
              (info->chrm_blue_y == info_00->chrm_blue_y)))))))))))) goto LAB_0011df88;
    }
    else {
      uVar1 = info->iccp_profile_size;
      if (uVar1 == info_00->iccp_profile_size) {
        if ((ulong)uVar1 != 0) {
          uVar3 = 0;
          do {
            if (info->iccp_profile[uVar3] != info_00->iccp_profile[uVar3]) goto LAB_0011e086;
            uVar3 = uVar3 + 1;
          } while (uVar1 != uVar3);
        }
LAB_0011df88:
        uVar1 = lodepng_convert(out,in,&state_out->info_raw,&state_in->info_raw,w,h);
        return uVar1;
      }
    }
  }
LAB_0011e086:
  out_00 = (float *)malloc((ulong)(w * h * 4) << 2);
  uVar1 = convertToXYZ(out_00,local_3c,in,w,h,state_in);
  if (uVar1 == 0) {
    uVar1 = convertFromXYZ(out,out_00,w,h,state_out,local_3c,rendering_intent);
  }
  free(out_00);
  return uVar1;
}

Assistant:

unsigned convertRGBModel(unsigned char* out, const unsigned char* in,
                         unsigned w, unsigned h,
                         const LodePNGState* state_out,
                         const LodePNGState* state_in,
                         unsigned rendering_intent) {
  if(modelsEqual(state_in, state_out)) {
    return lodepng_convert(out, in, &state_out->info_raw, &state_in->info_raw, w, h);
  } else {
    unsigned error = 0;
    float* xyz = (float*)lodepng_malloc(w * h * 4 * sizeof(float));
    float whitepoint[3];
    error = convertToXYZ(&xyz[0], whitepoint, in, w, h, state_in);
    if (!error) error = convertFromXYZ(out, &xyz[0], w, h, state_out, whitepoint, rendering_intent);
    lodepng_free(xyz);
    return error;
  }
}